

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

void ncnn::pack_B_tile_quantize(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float in_stack_0000049c;
  int in_stack_000004a0;
  int in_stack_000004a4;
  int in_stack_000004a8;
  int in_stack_000004ac;
  Mat *in_stack_000004b0;
  Mat *in_stack_000004b8;
  
  pack_B_tile_fp32_to_int8
            (in_stack_000004b8,in_stack_000004b0,in_stack_000004ac,in_stack_000004a8,
             in_stack_000004a4,in_stack_000004a0,in_stack_0000049c);
  return;
}

Assistant:

static void pack_B_tile_quantize(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}